

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O3

string * hexdump<unsigned_char_const*>
                   (string *__return_storage_ptr__,uchar *buf,int nLength,int nDumpUnitSize,
                   EndianType et)

{
  char *pcVar1;
  char *pcVar2;
  
  if (nLength < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "hexdump-ERROR";
    pcVar1 = "";
  }
  else if (nLength == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = "";
    pcVar2 = "";
  }
  else {
    if (buf != (uchar *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      if (et == ET_LITTLEENDIAN) {
        switch(nDumpUnitSize) {
        case 1:
          hexdumpbytes<unsigned_char_const*>(__return_storage_ptr__,buf,(ulong)(uint)nLength,' ');
          return __return_storage_ptr__;
        case 2:
          hexdumpwords<unsigned_char_const*>(__return_storage_ptr__,buf,(ulong)(uint)nLength,' ');
          return __return_storage_ptr__;
        default:
          return __return_storage_ptr__;
        case 4:
          hexdumpdwords<unsigned_char_const*>(__return_storage_ptr__,buf,(ulong)(uint)nLength,' ');
          return __return_storage_ptr__;
        case 8:
          hexdumpqwords<unsigned_char_const*>(__return_storage_ptr__,buf,(ulong)(uint)nLength);
          return __return_storage_ptr__;
        }
      }
      hexdumpgroups<unsigned_char_const*>
                (__return_storage_ptr__,buf,(long)(nLength * nDumpUnitSize),nDumpUnitSize,' ');
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "(null)";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string hexdump(I buf, int nLength, int nDumpUnitSize=1, enum EndianType et=ET_LITTLEENDIAN )
{
    if (nLength<0)
        return "hexdump-ERROR";
    if (nLength>0 && isnullptr(buf))
        return "(null)";
    if (nLength==0)
        return "";

    int nCharsInResult= nLength*(nDumpUnitSize==1?3:
                                 nDumpUnitSize==2?5:
                                 nDumpUnitSize==4?9:
                                 nDumpUnitSize==8?17:
                                 9);
    std::string line;

    line.reserve(nCharsInResult);

    if (et==ET_LITTLEENDIAN)
        switch(nDumpUnitSize)
        {
            case 1: hexdumpbytes(line, buf, nLength); break;
            case 2: hexdumpwords(line, buf, nLength); break;
            case 4: hexdumpdwords(line, buf, nLength); break;
            case 8: hexdumpqwords(line, buf, nLength); break;
        }
    else {
        hexdumpgroups(line, buf, nLength*nDumpUnitSize, nDumpUnitSize);
    }
    return line;
}